

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

PHYSFS_File * PHYSFS_openRead(char *_fname)

{
  void *pvVar1;
  _func_PHYSFS_Io_ptr_void_ptr_char_ptr *p_Var2;
  _func_void_PHYSFS_Io_ptr *p_Var3;
  char *pcVar4;
  int iVar5;
  char *in_RAX;
  size_t sVar6;
  ulong *puVar7;
  PHYSFS_Io *pPVar8;
  FileHandle *pFVar9;
  char **ppcVar10;
  PHYSFS_ErrorCode errcode;
  char *dst;
  DirHandle *h;
  bool bVar11;
  char *local_38;
  char *arcfname;
  
  ppcVar10 = &local_38;
  if (_fname == (char *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
  }
  else {
    local_38 = in_RAX;
    __PHYSFS_platformGrabMutex(stateLock);
    if (searchPath == (DirHandle *)0x0) {
      errcode = PHYSFS_ERR_NOT_FOUND;
    }
    else {
      sVar6 = strlen(_fname);
      if (sVar6 + longest_root + 2 < 0x100) {
        puVar7 = (ulong *)((long)&local_38 - (longest_root + sVar6 + 0x19 & 0xfffffffffffffff0));
        ppcVar10 = (char **)puVar7;
      }
      else {
        puVar7 = (ulong *)0x0;
        ppcVar10 = &local_38;
      }
      bVar11 = puVar7 == (ulong *)0x0;
      if (bVar11) {
        ppcVar10[-1] = (char *)0x109998;
        puVar7 = (ulong *)(*__PHYSFS_AllocatorHooks.Malloc)(longest_root + sVar6 + 10);
      }
      if (puVar7 == (ulong *)0x0) {
        puVar7 = (ulong *)0x0;
      }
      else {
        *puVar7 = (ulong)bVar11;
        puVar7 = puVar7 + 1;
      }
      if (puVar7 != (ulong *)0x0) {
        dst = (char *)((long)puVar7 + longest_root + 1);
        ppcVar10[-1] = (char *)0x1099d0;
        iVar5 = sanitizePlatformIndependentPath(_fname,dst);
        if (iVar5 != 0) {
          pPVar8 = (PHYSFS_Io *)0x0;
          h = searchPath;
          if (searchPath != (DirHandle *)0x0) {
            do {
              local_38 = dst;
              ppcVar10[-1] = (char *)0x1099fc;
              iVar5 = verifyPath(h,&local_38,0);
              pcVar4 = local_38;
              if (iVar5 == 0) {
                bVar11 = true;
              }
              else {
                pvVar1 = h->opaque;
                p_Var2 = h->funcs->openRead;
                ppcVar10[-1] = (char *)0x109a0e;
                pPVar8 = (*p_Var2)(pvVar1,pcVar4);
                bVar11 = pPVar8 == (PHYSFS_Io *)0x0;
              }
            } while ((bVar11) && (h = h->next, h != (DirHandle *)0x0));
          }
          if (pPVar8 != (PHYSFS_Io *)0x0) {
            ppcVar10[-1] = (char *)0x109a3c;
            pFVar9 = (FileHandle *)(*__PHYSFS_AllocatorHooks.Malloc)(0x40);
            if (pFVar9 != (FileHandle *)0x0) {
              pFVar9->io = (PHYSFS_Io *)0x0;
              *(undefined8 *)&pFVar9->forReading = 0;
              pFVar9->dirHandle = (DirHandle *)0x0;
              pFVar9->buffer = (PHYSFS_uint8 *)0x0;
              pFVar9->bufpos = 0;
              pFVar9->next = (__PHYSFS_FILEHANDLE__ *)0x0;
              pFVar9->bufsize = 0;
              pFVar9->buffill = 0;
              pFVar9->io = pPVar8;
              pFVar9->forReading = '\x01';
              pFVar9->dirHandle = h;
              pFVar9->next = openReadList;
              openReadList = pFVar9;
              goto LAB_00109ab5;
            }
            p_Var3 = pPVar8->destroy;
            ppcVar10[-1] = (char *)0x109aa8;
            (*p_Var3)(pPVar8);
            ppcVar10[-1] = (char *)0x109ab2;
            PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
          }
        }
        pFVar9 = (FileHandle *)0x0;
LAB_00109ab5:
        ppcVar10[-1] = (char *)0x109ac1;
        __PHYSFS_platformReleaseMutex(stateLock);
        if (puVar7[-1] == 0) {
          return (PHYSFS_File *)pFVar9;
        }
        ppcVar10[-1] = (char *)0x109ad5;
        (*__PHYSFS_AllocatorHooks.Free)(puVar7 + -1);
        return (PHYSFS_File *)pFVar9;
      }
      errcode = PHYSFS_ERR_OUT_OF_MEMORY;
    }
    *(undefined8 *)((long)ppcVar10 + -8) = 0x109a80;
    PHYSFS_setErrorCode(errcode);
    *(undefined8 *)((long)ppcVar10 + -8) = 0x109a8c;
    __PHYSFS_platformReleaseMutex(stateLock);
  }
  return (PHYSFS_File *)0x0;
}

Assistant:

PHYSFS_File *PHYSFS_openRead(const char *_fname)
{
    FileHandle *fh = NULL;
    char *allocated_fname;
    char *fname;
    size_t len;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    __PHYSFS_platformGrabMutex(stateLock);

    BAIL_IF_MUTEX(!searchPath, PHYSFS_ERR_NOT_FOUND, stateLock, 0);

    len = strlen(_fname) + longest_root + 2;
    allocated_fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF_MUTEX(!allocated_fname, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, 0);
    fname = allocated_fname + longest_root + 1;

    if (sanitizePlatformIndependentPath(_fname, fname))
    {
        PHYSFS_Io *io = NULL;
        DirHandle *i;

        for (i = searchPath; i != NULL; i = i->next)
        {
            char *arcfname = fname;
            if (verifyPath(i, &arcfname, 0))
            {
                io = i->funcs->openRead(i->opaque, arcfname);
                if (io)
                    break;
            } /* if */
        } /* for */

        if (io)
        {
            fh = (FileHandle *) allocator.Malloc(sizeof (FileHandle));
            if (fh == NULL)
            {
                io->destroy(io);
                PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
            } /* if */
            else
            {
                memset(fh, '\0', sizeof (FileHandle));
                fh->io = io;
                fh->forReading = 1;
                fh->dirHandle = i;
                fh->next = openReadList;
                openReadList = fh;
            } /* else */
        } /* if */
    } /* if */

    __PHYSFS_platformReleaseMutex(stateLock);
    __PHYSFS_smallFree(allocated_fname);
    return ((PHYSFS_File *) fh);
}